

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

bool __thiscall
OpenMesh::PolyConnectivity::is_collapse_ok(PolyConnectivity *this,HalfedgeHandle v0v1)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  EdgeHandle _eh;
  HalfedgeHandle _heh;
  VertexHandle _vh;
  VertexHandle _vh_00;
  FaceHandle FVar4;
  uint uVar5;
  HalfedgeHandle HVar6;
  HalfedgeHandle HVar7;
  value_type vVar8;
  StatusInfo *pSVar9;
  bool bVar10;
  bool local_1e2;
  bool local_1e1;
  BaseHandle local_1c4;
  int local_1c0;
  BaseHandle local_1bc;
  int local_1b8;
  BaseHandle local_1b4;
  int local_1b0;
  BaseHandle local_1ac;
  BaseHandle local_1a8;
  BaseHandle local_1a4;
  BaseHandle local_1a0;
  BaseHandle local_19c;
  BaseHandle local_198;
  BaseHandle local_194;
  HalfedgeHandle two_1;
  HalfedgeHandle one_1;
  BaseHandle local_184;
  int local_180;
  BaseHandle local_17c;
  int local_178;
  BaseHandle local_174;
  int local_170;
  BaseHandle local_16c;
  BaseHandle local_168;
  BaseHandle local_164;
  BaseHandle local_160;
  BaseHandle local_15c;
  BaseHandle local_158;
  BaseHandle local_154;
  HalfedgeHandle two;
  HalfedgeHandle one;
  VertexVertexIter local_140;
  BaseHandle local_128;
  BaseHandle local_124;
  VertexVertexIter local_120;
  BaseHandle local_108;
  BaseHandle local_104;
  VertexVertexIter local_100;
  undefined1 local_e8 [8];
  VertexVertexIter vv_it;
  HalfedgeHandle h2_1;
  HalfedgeHandle h1_1;
  HalfedgeHandle h2;
  HalfedgeHandle h1;
  BaseHandle local_64;
  BaseHandle local_60;
  VertexHandle v_10_n;
  BaseHandle local_58;
  BaseHandle local_54;
  VertexHandle v_01_n;
  bool v1v0_triangle;
  bool v0v1_triangle;
  VertexHandle v1;
  VertexHandle v0;
  HalfedgeHandle v1v0;
  PolyConnectivity *this_local;
  HalfedgeHandle v0v1_local;
  
  _eh = ArrayKernel::edge_handle(&this->super_ArrayKernel,v0v1);
  pSVar9 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  bVar1 = Attributes::StatusInfo::deleted(pSVar9);
  if (bVar1) {
    return false;
  }
  _heh = ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,v0v1);
  _vh = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,_heh);
  _vh_00 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,v0v1);
  bVar1 = false;
  bVar10 = false;
  bVar2 = is_boundary(this,v0v1);
  if (!bVar2) {
    FVar4 = ArrayKernel::face_handle(&this->super_ArrayKernel,v0v1);
    uVar5 = valence(this,FVar4);
    bVar1 = uVar5 == 3;
  }
  bVar2 = is_boundary(this,_heh);
  if (!bVar2) {
    local_54 = _heh.super_BaseHandle.idx_;
    v_01_n.super_BaseHandle.idx_ =
         (BaseHandle)ArrayKernel::face_handle(&this->super_ArrayKernel,_heh);
    uVar5 = valence(this,(FaceHandle)v_01_n.super_BaseHandle.idx_);
    bVar10 = uVar5 == 3;
  }
  local_60 = v0v1.super_BaseHandle.idx_;
  v_10_n.super_BaseHandle.idx_ =
       (BaseHandle)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,v0v1);
  local_58.idx_ =
       (int)ArrayKernel::to_vertex_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)v_10_n.super_BaseHandle.idx_);
  HVar6 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
  local_64.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar6);
  pSVar9 = ArrayKernel::status(&this->super_ArrayKernel,_vh);
  bVar2 = Attributes::StatusInfo::deleted(pSVar9);
  if (!bVar2) {
    pSVar9 = ArrayKernel::status(&this->super_ArrayKernel,_vh_00);
    bVar2 = Attributes::StatusInfo::deleted(pSVar9);
    if (!bVar2) {
      bVar2 = is_boundary(this,v0v1);
      if ((!bVar2) && (bVar1)) {
        HVar6 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,v0v1);
        HVar7 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar6);
        HVar6 = ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,HVar6);
        bVar2 = is_boundary(this,HVar6);
        local_1e1 = false;
        if (bVar2) {
          HVar6 = ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,HVar7);
          local_1e1 = is_boundary(this,HVar6);
        }
        if (local_1e1 != false) {
          return false;
        }
      }
      bVar2 = is_boundary(this,_heh);
      if ((!bVar2) && (bVar10)) {
        HVar6 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
        HVar7 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar6);
        HVar6 = ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,HVar6);
        bVar2 = is_boundary(this,HVar6);
        local_1e2 = false;
        if (bVar2) {
          HVar6 = ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,HVar7);
          local_1e2 = is_boundary(this,HVar6);
        }
        if (local_1e2 != false) {
          return false;
        }
      }
      bVar2 = is_boundary(this,_vh);
      if ((((bVar2) && (bVar2 = is_boundary(this,_vh_00), bVar2)) &&
          (bVar2 = is_boundary(this,v0v1), !bVar2)) &&
         (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = _heh,
         bVar2 = is_boundary(this,_heh), !bVar2)) {
        return false;
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::GenericCirculatorT
                ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  *)local_e8);
      local_104 = _vh.super_BaseHandle.idx_;
      vv_iter(&local_100,this,_vh);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                   *)local_e8,&local_100);
      while (bVar2 = Iterators::
                     GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                     ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_e8), bVar2) {
        local_108.idx_ =
             (int)Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                               *)local_e8);
        pSVar9 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_108.idx_);
        Attributes::StatusInfo::set_tagged(pSVar9,false);
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)local_e8);
      }
      local_124 = _vh_00.super_BaseHandle.idx_;
      vv_iter(&local_120,this,_vh_00);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                   *)local_e8,&local_120);
      while (bVar2 = Iterators::
                     GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                     ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_e8), bVar2) {
        local_128.idx_ =
             (int)Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                               *)local_e8);
        pSVar9 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_128.idx_);
        Attributes::StatusInfo::set_tagged(pSVar9,true);
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)local_e8);
      }
      vv_iter(&local_140,this,_vh);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                   *)local_e8,&local_140);
      while (bVar2 = Iterators::
                     GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                     ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_e8), bVar2) {
        vVar8 = Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                             *)local_e8);
        pSVar9 = ArrayKernel::status(&this->super_ArrayKernel,
                                     (VertexHandle)vVar8.super_BaseHandle.idx_);
        bVar3 = Attributes::StatusInfo::tagged(pSVar9);
        bVar2 = false;
        if (bVar3) {
          one.super_BaseHandle.idx_ =
               (BaseHandle)
               Iterators::
               GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
               ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                            *)local_e8);
          bVar2 = BaseHandle::operator==(&one.super_BaseHandle,&local_58);
          if ((!bVar2) || (bVar2 = false, !bVar1)) {
            two.super_BaseHandle.idx_ =
                 (BaseHandle)
                 Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                 ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                              *)local_e8);
            bVar3 = BaseHandle::operator==(&two.super_BaseHandle,&local_64);
            bVar2 = bVar10;
            if (!bVar3) {
              bVar2 = false;
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
        }
        if (bVar2) {
          return false;
        }
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)local_e8);
      }
      if (bVar1) {
        HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_154,-1);
        HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_158,-1);
        local_160 = v0v1.super_BaseHandle.idx_;
        local_168.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,v0v1);
        local_15c.idx_ = local_168.idx_;
        local_154.idx_ = local_168.idx_;
        local_164.idx_ =
             (int)ArrayKernel::next_halfedge_handle
                            (&this->super_ArrayKernel,(HalfedgeHandle)local_168.idx_);
        local_170 = local_154.idx_;
        local_158.idx_ = local_164.idx_;
        local_16c.idx_ =
             (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_154.idx_);
        local_178 = local_158.idx_;
        local_154.idx_ = local_16c.idx_;
        local_174.idx_ =
             (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_158.idx_);
        local_180 = local_154.idx_;
        local_158.idx_ = local_174.idx_;
        local_17c.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,local_154.idx_);
        local_184.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,local_158.idx_);
        bVar3 = BaseHandle::operator==(&local_17c,&local_184);
        bVar2 = false;
        if (bVar3) {
          two_1.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_154.idx_;
          FVar4 = ArrayKernel::face_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_154.idx_);
          uVar5 = valence(this,FVar4);
          bVar2 = uVar5 != 3;
        }
        if (bVar2) {
          return false;
        }
      }
      if (bVar10) {
        HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_194,-1);
        HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_198,-1);
        local_1a0 = _heh.super_BaseHandle.idx_;
        local_1a8.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
        local_19c.idx_ = local_1a8.idx_;
        local_194.idx_ = local_1a8.idx_;
        local_1a4.idx_ =
             (int)ArrayKernel::next_halfedge_handle
                            (&this->super_ArrayKernel,(HalfedgeHandle)local_1a8.idx_);
        local_1b0 = local_194.idx_;
        local_198.idx_ = local_1a4.idx_;
        local_1ac.idx_ =
             (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_194.idx_);
        local_1b8 = local_198.idx_;
        local_194.idx_ = local_1ac.idx_;
        local_1b4.idx_ =
             (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_198.idx_);
        local_1c0 = local_194.idx_;
        local_198.idx_ = local_1b4.idx_;
        local_1bc.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,local_194.idx_);
        local_1c4.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,local_198.idx_);
        bVar3 = BaseHandle::operator==(&local_1bc,&local_1c4);
        bVar2 = false;
        if (bVar3) {
          FVar4 = ArrayKernel::face_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_194.idx_);
          uVar5 = valence(this,FVar4);
          bVar2 = uVar5 != 3;
        }
        if (bVar2) {
          return false;
        }
      }
      vVar8 = Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                           *)local_e8);
      pSVar9 = ArrayKernel::status(&this->super_ArrayKernel,
                                   (VertexHandle)vVar8.super_BaseHandle.idx_);
      bVar3 = Attributes::StatusInfo::tagged(pSVar9);
      bVar2 = false;
      if (bVar3) {
        bVar3 = BaseHandle::operator==(&local_58,&local_64);
        bVar2 = false;
        if ((bVar3) && (bVar2 = false, bVar1)) {
          bVar2 = bVar10;
        }
      }
      if (!bVar2) {
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool PolyConnectivity::is_collapse_ok(HalfedgeHandle v0v1)
{
  //is edge already deleteed?
  if (status(edge_handle(v0v1)).deleted())
  {
    return false;
  }

  HalfedgeHandle v1v0(opposite_halfedge_handle(v0v1));
  VertexHandle v0(to_vertex_handle(v1v0));
  VertexHandle v1(to_vertex_handle(v0v1));  

  bool v0v1_triangle = false;
  bool v1v0_triangle = false;
  
  if (!is_boundary(v0v1))
    v0v1_triangle = valence(face_handle(v0v1)) == 3;
  
  if (!is_boundary(v1v0))
    v1v0_triangle = valence(face_handle(v1v0)) == 3;

  //in a quadmesh we dont have the "next" or "previous" vhandle, so we need to look at previous and next on both sides
  //VertexHandle v_01_p = from_vertex_handle(prev_halfedge_handle(v0v1));
  VertexHandle v_01_n = to_vertex_handle(next_halfedge_handle(v0v1));  

  //VertexHandle v_10_p = from_vertex_handle(prev_halfedge_handle(v1v0));
  VertexHandle v_10_n = to_vertex_handle(next_halfedge_handle(v1v0));

  //are the vertices already deleted ?
  if (status(v0).deleted() || status(v1).deleted())
  {
    return false;
  }

  //the edges v1-vl and vl-v0 must not be both boundary edges
  //this test makes only sense in a polymesh if the side face is a triangle
  if (!is_boundary(v0v1))
  {
    if (v0v1_triangle)
    {
      //VertexHandle vl = to_vertex_handle(next_halfedge_handle(v0v1));

      HalfedgeHandle h1 = next_halfedge_handle(v0v1);
      HalfedgeHandle h2 = next_halfedge_handle(h1);
      if (is_boundary(opposite_halfedge_handle(h1)) && is_boundary(opposite_halfedge_handle(h2)))
        return false;
    }
  }

  //the edges v0-vr and vr-v1 must not be both boundary edges
  //this test makes only sense in a polymesh if the side face is a triangle
  if (!is_boundary(v1v0))
  {
    if (v1v0_triangle)
    {
      //VertexHandle vr = to_vertex_handle(next_halfedge_handle(v1v0));

      HalfedgeHandle h1 = next_halfedge_handle(v1v0);
      HalfedgeHandle h2 = next_halfedge_handle(h1);
      if (is_boundary(opposite_halfedge_handle(h1)) && is_boundary(opposite_halfedge_handle(h2)))
        return false;
    }
  }

  // edge between two boundary vertices should be a boundary edge
  if ( is_boundary(v0) && is_boundary(v1) && !is_boundary(v0v1) && !is_boundary(v1v0))
    return false;
  
  VertexVertexIter vv_it;
  // test intersection of the one-rings of v0 and v1
  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
  {
    status(*vv_it).set_tagged(false);
  }

  for (vv_it = vv_iter(v1); vv_it.is_valid(); ++vv_it)
  {
    status(*vv_it).set_tagged(true);
  }

  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
  {
    if (status(*vv_it).tagged() &&
      !(*vv_it == v_01_n && v0v1_triangle) &&
      !(*vv_it == v_10_n && v1v0_triangle)
      )
    {
      return false;
    }
  }
  
  //test for a face on the backside/other side that might degenerate
  if (v0v1_triangle)
  {
    HalfedgeHandle one, two;
    one = next_halfedge_handle(v0v1);
    two = next_halfedge_handle(one);
    
    one = opposite_halfedge_handle(one);
    two = opposite_halfedge_handle(two);
    
    if (face_handle(one) == face_handle(two) && valence(face_handle(one)) != 3)
    {
      return false;
    }
  }
  
  if (v1v0_triangle)
  {
    HalfedgeHandle one, two;
    one = next_halfedge_handle(v1v0);
    two = next_halfedge_handle(one);
    
    one = opposite_halfedge_handle(one);
    two = opposite_halfedge_handle(two);
    
    if (face_handle(one) == face_handle(two) && valence(face_handle(one)) != 3)
    {
      return false;
    }
  }

  if (status(*vv_it).tagged() && v_01_n == v_10_n && v0v1_triangle && v1v0_triangle)
  {
    return false;
  }

  // passed all tests
  return true;
}